

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

void __thiscall ChannelConverter::convert(ChannelConverter *this,void *src,float *dst,ALuint frames)

{
  size_t i_8;
  int *piVar1;
  short *psVar2;
  ushort *puVar3;
  char *pcVar4;
  float *pfVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  SampleType *ssrc;
  float fVar11;
  
  uVar9 = this->mChanMask;
  if (this->mDstChans == DevFmtMono) {
    if (this->mSrcType < (DevFmtFloat|DevFmtUByte)) {
      uVar10 = uVar9 - (uVar9 >> 1 & 0x55555555);
      uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
      fVar11 = SQRT(1.0 / (float)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18));
      switch(this->mSrcType) {
      case DevFmtByte:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            pcVar4 = (char *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)(int)*pcVar4 * 0.0078125 + dst[uVar7];
              pcVar4 = pcVar4 + uVar10;
            }
          }
          src = (void *)((long)src + 1);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtUByte:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            pcVar4 = (char *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)(int)(char)(*pcVar4 + -0x80) * 0.0078125 + dst[uVar7];
              pcVar4 = pcVar4 + uVar10;
            }
          }
          src = (void *)((long)src + 1);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtShort:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            psVar2 = (short *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)(int)*psVar2 * 3.0517578e-05 + dst[uVar7];
              psVar2 = psVar2 + uVar10;
            }
          }
          src = (void *)((long)src + 2);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtUShort:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            puVar3 = (ushort *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)(int)(short)(*puVar3 ^ 0x8000) * 3.0517578e-05 + dst[uVar7];
              puVar3 = puVar3 + uVar10;
            }
          }
          src = (void *)((long)src + 2);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtInt:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            piVar1 = (int *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)*piVar1 * 4.656613e-10 + dst[uVar7];
              piVar1 = piVar1 + uVar10;
            }
          }
          src = (void *)((long)src + 4);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtUInt:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            puVar6 = (uint *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = (float)(int)(*puVar6 ^ 0x80000000) * 4.656613e-10 + dst[uVar7];
              puVar6 = puVar6 + uVar10;
            }
          }
          src = (void *)((long)src + 4);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
        break;
      case DevFmtFloat:
        uVar10 = this->mSrcStep;
        uVar8 = (ulong)frames;
        std::__fill_n_a<float*,unsigned_long,float>(dst,uVar8);
        for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
          if ((uVar9 & 1) != 0) {
            pfVar5 = (float *)src;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              dst[uVar7] = *pfVar5 + dst[uVar7];
              pfVar5 = pfVar5 + uVar10;
            }
          }
          src = (void *)((long)src + 4);
        }
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          dst[uVar7] = dst[uVar7] * fVar11;
        }
      }
    }
  }
  else if (this->mDstChans == DevFmtChannelsDefault && uVar9 == 1) {
    switch(this->mSrcType) {
    case DevFmtByte:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)(int)*(char *)((long)src + uVar8) * 0.0078125 * 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtUByte:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)(int)(char)(*(char *)((long)src + uVar8) + -0x80) * 0.0078125 * 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtShort:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)(int)*(short *)((long)src + uVar8 * 2) * 3.0517578e-05 * 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtUShort:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)(int)(short)(*(ushort *)((long)src + uVar8 * 2) ^ 0x8000) * 3.0517578e-05 *
                 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtInt:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)*(int *)((long)src + uVar8 * 4) * 4.656613e-10 * 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtUInt:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = (float)(int)(*(uint *)((long)src + uVar8 * 4) ^ 0x80000000) * 4.656613e-10 *
                 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
      break;
    case DevFmtFloat:
      for (uVar8 = 0; frames != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = *(float *)((long)src + uVar8 * 4) * 0.70710677;
        dst[uVar8 * 2] = fVar11;
        dst[uVar8 * 2 + 1] = fVar11;
      }
    }
  }
  return;
}

Assistant:

void ChannelConverter::convert(const void *src, float *dst, ALuint frames) const
{
    if(mDstChans == DevFmtMono)
    {
        const float scale{std::sqrt(1.0f / static_cast<float>(PopCount(mChanMask)))};
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Multi2Mono<T>(mChanMask, mSrcStep, scale, dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
    else if(mChanMask == 0x1 && mDstChans == DevFmtStereo)
    {
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Mono2Stereo<T>(dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
}